

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::internal::ExtensionSet::InternalSerializeWithCachedSizesToArray
          (ExtensionSet *this,int start_field_number,int end_field_number,bool deterministic,
          uint8 *target)

{
  const_iterator cVar1;
  int local_2c;
  
  local_2c = start_field_number;
  cVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
          ::lower_bound((_Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
                         *)this,&local_2c);
  for (; ((_Rb_tree_header *)cVar1._M_node !=
          &(this->extensions_)._M_t._M_impl.super__Rb_tree_header &&
         ((int)cVar1._M_node[1]._M_color < end_field_number));
      cVar1._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar1._M_node)) {
    target = Extension::InternalSerializeFieldWithCachedSizesToArray
                       ((Extension *)&cVar1._M_node[1]._M_parent,cVar1._M_node[1]._M_color,
                        deterministic,target);
  }
  return target;
}

Assistant:

uint8* ExtensionSet::InternalSerializeWithCachedSizesToArray(
    int start_field_number, int end_field_number,
    bool deterministic, uint8* target) const {
  ExtensionMap::const_iterator iter;
  for (iter = extensions_.lower_bound(start_field_number);
       iter != extensions_.end() && iter->first < end_field_number;
       ++iter) {
    target = iter->second.InternalSerializeFieldWithCachedSizesToArray(
        iter->first, deterministic, target);
  }
  return target;
}